

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::isSubnodeExistsInNode(Analyzer *this,Node *node,Node *subnode)

{
  pointer ppNVar1;
  Node *node_00;
  bool bVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  
  bVar2 = isNodeEquals(this,node,subnode);
  bVar4 = true;
  if (!bVar2) {
    uVar3 = 0;
    while( true ) {
      ppNVar1 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar4 = uVar3 < (ulong)((long)(node->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
      if (!bVar4) break;
      node_00 = ppNVar1[uVar3];
      if ((node_00 != (Node *)0x0) && (bVar2 = isSubnodeExistsInNode(this,node_00,subnode), bVar2))
      {
        return bVar4;
      }
      uVar3 = uVar3 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool isSubnodeExistsInNode(Node * node, Node * subnode)
  {
    if (isNodeEquals(node, subnode))
      return true;

    for (size_t i = 0; i < node->children.size(); i++)
      if (node->children[i])
        if (isSubnodeExistsInNode(node->children[i], subnode))
          return true;

    return false;
  }